

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

char * GrowSubId(char **p)

{
  char cVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  bool startsAtUnderscore;
  bool isSubwordSubstitution;
  char **p_local;
  
  bVar3 = DAT_001e16a7 & 1;
  cVar1 = **p;
  do {
    iVar4 = islabchar(**p);
    if (iVar4 == 0) break;
    pcVar5 = *p;
    *p = pcVar5 + 1;
    pcVar2 = nidsubp + 1;
    *nidsubp = *pcVar5;
    nidsubp = pcVar2;
  } while ((bVar3 == 0) || ((**p == '_') == (cVar1 == '_')));
  if (nidtemp + 0x7ff < nidsubp) {
    Error("ID too long, buffer overflow detected.",(char *)0x0,FATAL);
  }
  *nidsubp = '\0';
  pcVar5 = (char *)0x0;
  if (nidtemp[0] != '\0') {
    pcVar5 = nidtemp;
  }
  return pcVar5;
}

Assistant:

char* GrowSubId(char* & p) {	// appends next part of ID
	// The caller function ReplaceDefineInternal already assures the first char of ID is (isalpha() || '_')
	// so there are no extra tests here to verify validity of first character (like GetID(..) must do)
	const bool isSubwordSubstitution = Options::syx.IsSubwordSubstitution;	// help compiler -O2
	bool startsAtUnderscore = ('_' == *p);
	// add sub-parts delimiter in separate step (i.e. new ID grows like: "a", "a_", "a_b", ...)
	while (islabchar(*p)) {
		*nidsubp++ = *p++;
		// break at sub-word boundaries when new underscore block starts or ends
		if (isSubwordSubstitution && (('_' == *p) != startsAtUnderscore)) break;
	}
	if (nidtemp+LINEMAX <= nidsubp) Error("ID too long, buffer overflow detected.", NULL, FATAL);
	*nidsubp = 0;
	return nidtemp[0] ? nidtemp : nullptr;	// return non-empty string or nullptr
}